

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

void inproc_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&nni_inproc.mx);
  _Var1 = nni_aio_start(aio,inproc_ep_cancel,arg);
  if (_Var1) {
    nni_aio_list_append((nni_list *)((long)arg + 0x80),aio);
    inproc_accept_clients((inproc_ep *)arg);
  }
  nni_mtx_unlock(&nni_inproc.mx);
  return;
}

Assistant:

static void
inproc_ep_accept(void *arg, nni_aio *aio)
{
	inproc_ep *ep = arg;

	nni_aio_reset(aio);

	nni_mtx_lock(&nni_inproc.mx);

	// We need not worry about the case where a non-blocking
	// accept was tried -- there is no API to do such a thing.
	if (!nni_aio_start(aio, inproc_ep_cancel, ep)) {
		nni_mtx_unlock(&nni_inproc.mx);
		return;
	}

	// We are already on the master list of servers, thanks to bind.
	// Insert us into pending server aios, and then run accept list.
	nni_aio_list_append(&ep->aios, aio);
	inproc_accept_clients(ep);
	nni_mtx_unlock(&nni_inproc.mx);
}